

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_finish_handshake
              (ptls_t *tls,ptls_message_emitter_t *emitter,int send_cert_verify,
              st_ptls_signature_algorithms_t *signature_algorithms)

{
  size_t *psVar1;
  char *pcVar2;
  uint8_t *puVar3;
  st_ptls_encrypt_ticket_t *psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  ptls_key_schedule_t *ppVar11;
  st_ptls_hash_context_t *psVar12;
  ulong uVar13;
  uint64_t uVar14;
  size_t sVar15;
  ptls_context_t *ppVar16;
  long lVar17;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *secret;
  ptls_hash_context_t **pppVar18;
  byte bVar19;
  ptls_buffer_t *ppVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  uint8_t *puVar25;
  ptls_buffer_t *ppVar26;
  size_t sVar27;
  ptls_iovec_t pVar28;
  uint16_t _v;
  uint32_t _v_2;
  uint16_t _v_1;
  char session_id_smallbuf [128];
  ptls_buffer_t local_130;
  uint8_t *local_110;
  uint8_t *local_108;
  char *local_100;
  undefined4 local_f4;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  uint8_t local_d8 [128];
  uint8_t *local_58;
  size_t local_50;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_48;
  undefined8 local_40;
  st_ptls_hash_context_t *local_38;
  undefined8 uVar20;
  
  if ((send_cert_verify == 0) ||
     (iVar9 = send_certificate_verify
                        (tls,emitter,signature_algorithms,"TLS 1.3, server CertificateVerify"),
     iVar9 == 0)) {
    iVar9 = send_finished(tls,emitter);
    if (iVar9 == 0) {
      if (tls->key_schedule->generation != 2) {
        __assert_fail("tls->key_schedule->generation == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x1336,
                      "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                     );
      }
      iVar9 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar9 == 0) &&
           (iVar9 = setup_traffic_protection(tls,1,"s ap traffic",3,0,0), iVar9 == 0)) &&
          (iVar9 = derive_secret(tls->key_schedule,&tls->field_19,"c ap traffic"), iVar9 == 0)) &&
         (iVar9 = derive_exporter_secret(tls,0), iVar9 == 0)) {
        ppVar16 = tls->ctx;
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
          if ((ppVar16->field_0xb8 & 8) == 0) {
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          }
          else {
            tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
          }
        }
        else if ((ppVar16->field_0xb8 & 0x10) == 0) {
          tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
        else {
          iVar9 = commission_handshake_secret(tls);
          if (iVar9 != 0) {
            return iVar9;
          }
          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          ppVar16 = tls->ctx;
        }
        if ((tls->field_19).server.num_tickets_to_send != '\0') {
          if (ppVar16->ticket_lifetime == 0) {
            __assert_fail("tls->ctx->ticket_lifetime != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                          ,0x1350,
                          "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                         );
          }
          local_48 = &tls->traffic_protection;
          ppVar11 = tls->key_schedule;
          uVar20 = 0;
          do {
            psVar12 = ppVar11->hashes[0].ctx;
            psVar12 = (*psVar12->clone_)(psVar12);
            ppVar16 = tls->ctx;
            if (ppVar16->ticket_lifetime == 0) {
              __assert_fail("tls->ctx->ticket_lifetime != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                            ,0x755,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
            }
            if (ppVar16->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
              __assert_fail("tls->ctx->encrypt_ticket != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                            ,0x756,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
            }
            local_130.off = 0;
            local_130.capacity = 0x80;
            local_130.is_allocated = '\0';
            local_130.align_bits = '\0';
            ppVar26 = emitter->buf;
            sVar27 = ppVar26->off;
            local_130.base = local_d8;
            local_40 = uVar20;
            local_38 = psVar12;
            if ((tls->pending_handshake_secret == (uint8_t *)0x0) ||
               ((ppVar16->field_0xb8 & 0x10) != 0)) {
LAB_00112c15:
              ppVar11 = tls->key_schedule;
              iVar9 = ptls_buffer_reserve_aligned(ppVar26,1,'\0');
              if (iVar9 != 0) goto LAB_00112c4e;
              ppVar26->base[ppVar26->off] = '\x14';
              ppVar26->off = ppVar26->off + 1;
              iVar9 = ptls_buffer_reserve_aligned(ppVar26,3,'\0');
              if (iVar9 != 0) goto LAB_00112c4e;
              puVar25 = ppVar26->base;
              sVar24 = ppVar26->off;
              puVar25[sVar24 + 2] = '\0';
              puVar25 = puVar25 + sVar24;
              puVar25[0] = '\0';
              puVar25[1] = '\0';
              sVar24 = ppVar26->off;
              ppVar26->off = sVar24 + 3;
              iVar10 = ptls_buffer_reserve_aligned
                                 (emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size,'\0'
                                 );
              if (iVar10 == 0) {
                secret = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                         tls->pending_handshake_secret;
                if ((anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                    tls->pending_handshake_secret ==
                    (anon_struct_208_2_4e55c0bb_for_traffic_protection *)0x0) {
                  secret = local_48;
                }
                local_108 = (uint8_t *)(sVar24 + 3);
                iVar10 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                          secret);
                if (iVar10 != 0) goto LAB_00112d28;
                psVar1 = &emitter->buf->off;
                *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
                uVar13 = ppVar26->off - (long)local_108;
                iVar10 = 0x20c;
                if (0xffffff < uVar13) goto LAB_00112d28;
                lVar17 = 0x10;
                do {
                  ppVar26->base[sVar24] = (uint8_t)(uVar13 >> ((byte)lVar17 & 0x3f));
                  lVar17 = lVar17 + -8;
                  sVar24 = sVar24 + 1;
                } while (lVar17 != -8);
                if ((ppVar11 != (ptls_key_schedule_t *)0x0) && (ppVar11->num_hashes != 0)) {
                  local_108 = ppVar26->base + sVar27;
                  sVar24 = ppVar26->off;
                  pppVar18 = &ppVar11->hashes[0].ctx;
                  sVar23 = 0;
                  do {
                    (*(*pppVar18)->update)(*pppVar18,local_108,sVar24 - sVar27);
                    sVar23 = sVar23 + 1;
                    pppVar18 = pppVar18 + 3;
                  } while (sVar23 != ppVar11->num_hashes);
                }
                emitter->buf->off = sVar27;
                (*tls->ctx->random_bytes)(&local_f4,4);
                if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                  sVar27 = 0;
                  puVar25 = local_d8;
LAB_00112eec:
                  iVar9 = (*emitter->begin_message)(emitter);
                  if (iVar9 == 0) {
                    ppVar26 = emitter->buf;
                    ppVar11 = tls->key_schedule;
                    local_108 = (uint8_t *)ppVar26->off;
                    iVar9 = ptls_buffer_reserve_aligned(ppVar26,1,'\0');
                    if (iVar9 == 0) {
                      ppVar26->base[ppVar26->off] = '\x04';
                      ppVar26->off = ppVar26->off + 1;
                      iVar9 = ptls_buffer_reserve_aligned(ppVar26,3,'\0');
                      if (iVar9 == 0) {
                        puVar3 = ppVar26->base;
                        sVar24 = ppVar26->off;
                        puVar3[sVar24 + 2] = '\0';
                        puVar3 = puVar3 + sVar24;
                        puVar3[0] = '\0';
                        puVar3[1] = '\0';
                        local_100 = (char *)ppVar26->off;
                        local_e8 = local_100 + 3;
                        ppVar26->off = (size_t)local_e8;
                        local_110 = (uint8_t *)CONCAT44(local_110._4_4_,tls->ctx->ticket_lifetime);
                        ppVar21 = emitter->buf;
                        iVar9 = ptls_buffer_reserve_aligned(ppVar21,4,'\0');
                        if (iVar9 == 0) {
                          *(uint *)(ppVar21->base + ppVar21->off) =
                               (uint)local_110 >> 0x18 | ((uint)local_110 & 0xff0000) >> 8 |
                               ((uint)local_110 & 0xff00) << 8 | (uint)local_110 << 0x18;
                          ppVar21->off = ppVar21->off + 4;
                          local_110 = (uint8_t *)CONCAT44(local_110._4_4_,local_f4);
                          ppVar21 = emitter->buf;
                          iVar9 = ptls_buffer_reserve_aligned(ppVar21,4,'\0');
                          if (iVar9 == 0) {
                            *(uint *)(ppVar21->base + ppVar21->off) =
                                 (uint)local_110 >> 0x18 | ((uint)local_110 & 0xff0000) >> 8 |
                                 ((uint)local_110 & 0xff00) << 8 | (uint)local_110 << 0x18;
                            ppVar21->off = ppVar21->off + 4;
                            ppVar21 = emitter->buf;
                            iVar9 = ptls_buffer_reserve_aligned(ppVar21,1,'\0');
                            if (iVar9 == 0) {
                              ppVar21->base[ppVar21->off] = '\0';
                              ppVar21->off = ppVar21->off + 1;
                              emitter->buf->base[emitter->buf->off - 1] = '\0';
                              ppVar21 = emitter->buf;
                              iVar9 = ptls_buffer_reserve_aligned(ppVar21,2,'\0');
                              if (iVar9 == 0) {
                                puVar3 = ppVar21->base;
                                sVar24 = ppVar21->off;
                                (puVar3 + sVar24)[0] = '\0';
                                (puVar3 + sVar24)[1] = '\0';
                                ppVar21->off = ppVar21->off + 2;
                                sVar24 = emitter->buf->off;
                                psVar4 = tls->ctx->encrypt_ticket;
                                pVar28.len = sVar27;
                                pVar28.base = puVar25;
                                iVar9 = (*psVar4->cb)(psVar4,tls,1,emitter->buf,pVar28);
                                if (iVar9 == 0) {
                                  uVar13 = emitter->buf->off - sVar24;
                                  iVar9 = iVar10;
                                  if (uVar13 < 0x10000) {
                                    emitter->buf->base[sVar24 - 2] = (uint8_t)(uVar13 >> 8);
                                    emitter->buf->base[sVar24 - 1] = (uint8_t)uVar13;
                                    ppVar21 = emitter->buf;
                                    iVar9 = ptls_buffer_reserve_aligned(ppVar21,2,'\0');
                                    if (iVar9 == 0) {
                                      puVar25 = ppVar21->base;
                                      sVar24 = ppVar21->off;
                                      (puVar25 + sVar24)[0] = '\0';
                                      (puVar25 + sVar24)[1] = '\0';
                                      ppVar21->off = ppVar21->off + 2;
                                      ppVar21 = emitter->buf;
                                      sVar24 = ppVar21->off;
                                      sVar23 = sVar24;
                                      if (tls->ctx->max_early_data_size == 0) {
LAB_001133f1:
                                        uVar13 = sVar23 - sVar24;
                                        iVar9 = iVar10;
                                        if (uVar13 < 0x10000) {
                                          ppVar21->base[sVar24 - 2] = (uint8_t)(uVar13 >> 8);
                                          emitter->buf->base[sVar24 - 1] = (uint8_t)uVar13;
                                          uVar13 = ppVar26->off - (long)local_e8;
                                          if (uVar13 < 0x1000000) {
                                            lVar17 = 0x10;
                                            do {
                                              local_100[(long)ppVar26->base] =
                                                   (char)(uVar13 >> ((byte)lVar17 & 0x3f));
                                              lVar17 = lVar17 + -8;
                                              local_100 = local_100 + 1;
                                            } while (lVar17 != -8);
                                            if ((ppVar11 != (ptls_key_schedule_t *)0x0) &&
                                               (ppVar11->num_hashes != 0)) {
                                              local_110 = ppVar26->base + (long)local_108;
                                              sVar24 = ppVar26->off - (long)local_108;
                                              pppVar18 = &ppVar11->hashes[0].ctx;
                                              sVar23 = 0;
                                              do {
                                                (*(*pppVar18)->update)(*pppVar18,local_110,sVar24);
                                                sVar23 = sVar23 + 1;
                                                pppVar18 = pppVar18 + 3;
                                              } while (sVar23 != ppVar11->num_hashes);
                                            }
                                            iVar9 = (*emitter->commit_message)(emitter);
                                          }
                                        }
                                      }
                                      else {
                                        iVar9 = ptls_buffer_reserve_aligned(ppVar21,2,'\0');
                                        if (iVar9 == 0) {
                                          puVar25 = ppVar21->base;
                                          sVar23 = ppVar21->off;
                                          (puVar25 + sVar23)[0] = '\0';
                                          (puVar25 + sVar23)[1] = '*';
                                          ppVar21->off = ppVar21->off + 2;
                                          ppVar21 = emitter->buf;
                                          iVar9 = ptls_buffer_reserve_aligned(ppVar21,2,'\0');
                                          if (iVar9 == 0) {
                                            puVar25 = ppVar21->base;
                                            sVar23 = ppVar21->off;
                                            (puVar25 + sVar23)[0] = '\0';
                                            (puVar25 + sVar23)[1] = '\0';
                                            ppVar21->off = ppVar21->off + 2;
                                            ppVar21 = emitter->buf;
                                            local_110 = (uint8_t *)ppVar21->off;
                                            local_e0 = CONCAT44(local_e0._4_4_,
                                                                tls->ctx->max_early_data_size);
                                            iVar9 = ptls_buffer_reserve_aligned(ppVar21,4,'\0');
                                            if (iVar9 == 0) {
                                              *(uint *)(ppVar21->base + ppVar21->off) =
                                                   (uint)local_e0 >> 0x18 |
                                                   ((uint)local_e0 & 0xff0000) >> 8 |
                                                   ((uint)local_e0 & 0xff00) << 8 |
                                                   (uint)local_e0 << 0x18;
                                              ppVar21->off = ppVar21->off + 4;
                                              uVar13 = emitter->buf->off - (long)local_110;
                                              iVar9 = iVar10;
                                              if (uVar13 < 0x10000) {
                                                local_110[(long)(emitter->buf->base + -2)] =
                                                     (uint8_t)(uVar13 >> 8);
                                                local_110[(long)(emitter->buf->base + -1)] =
                                                     (uint8_t)uVar13;
                                                ppVar21 = emitter->buf;
                                                sVar23 = ppVar21->off;
                                                goto LAB_001133f1;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  ppVar16 = tls->ctx;
                  ppVar11 = tls->key_schedule;
                  local_110 = (uint8_t *)CONCAT44(local_110._4_4_,local_f4);
                  local_100 = tls->server_name;
                  uVar8 = tls->key_share->id;
                  local_108 = (uint8_t *)CONCAT62(local_108._2_6_,tls->cipher_suite->id);
                  pcVar2 = tls->negotiated_protocol;
                  iVar9 = ptls_buffer_reserve_aligned(&local_130,2,'\0');
                  sVar24 = local_130.off;
                  sVar27 = local_130.off;
                  if (iVar9 == 0) {
                    (local_130.base + local_130.off)[0] = '\0';
                    (local_130.base + local_130.off)[1] = '\0';
                    local_130.off = local_130.off + 2;
                    local_e8 = pcVar2;
                    local_e0 = local_130.off;
                    iVar9 = ptls_buffer_reserve_aligned(&local_130,8,'\0');
                    sVar27 = local_130.off;
                    if (iVar9 == 0) {
                      builtin_memcpy(local_130.base + local_130.off,"ptls0001",8);
                      local_130.off = local_130.off + 8;
                      uVar14 = (*ppVar16->get_time->cb)(ppVar16->get_time);
                      iVar9 = ptls_buffer_reserve_aligned(&local_130,8,'\0');
                      sVar27 = local_130.off;
                      if (iVar9 == 0) {
                        *(uint64_t *)(local_130.base + local_130.off) =
                             uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                             (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                             (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                             (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
                        local_130.off = local_130.off + 8;
                        iVar9 = ptls_buffer_reserve_aligned(&local_130,2,'\0');
                        sVar23 = local_130.off;
                        sVar27 = local_130.off;
                        if (iVar9 == 0) {
                          (local_130.base + local_130.off)[0] = '\0';
                          (local_130.base + local_130.off)[1] = '\0';
                          local_130.off = local_130.off + 2;
                          local_50 = local_130.off;
                          iVar9 = ptls_buffer_reserve_aligned
                                            (&local_130,(ppVar11->hashes[0].algo)->digest_size,'\0')
                          ;
                          local_f0 = local_130.off;
                          sVar27 = local_130.off;
                          if (iVar9 == 0) {
                            local_58 = local_130.base;
                            iVar9 = derive_resumption_secret
                                              (ppVar11,local_130.base + local_130.off,
                                               (ptls_iovec_t)ZEXT816(0));
                            sVar27 = local_f0;
                            if (iVar9 == 0) {
                              local_130.off = local_f0 + (ppVar11->hashes[0].algo)->digest_size;
                              sVar27 = local_130.off;
                              iVar9 = iVar10;
                              if (local_130.off - local_50 < 0x10000) {
                                uVar7 = (ushort)(local_130.off - local_50);
                                *(ushort *)(local_58 + sVar23) = uVar7 << 8 | uVar7 >> 8;
                                iVar9 = ptls_buffer_reserve_aligned(&local_130,2,'\0');
                                sVar27 = local_130.off;
                                if (iVar9 == 0) {
                                  *(ushort *)(local_130.base + local_130.off) =
                                       uVar8 << 8 | uVar8 >> 8;
                                  local_130.off = local_130.off + 2;
                                  iVar9 = ptls_buffer_reserve_aligned(&local_130,2,'\0');
                                  sVar27 = local_130.off;
                                  if (iVar9 == 0) {
                                    *(ushort *)(local_130.base + local_130.off) =
                                         (ushort)local_108 << 8 | (ushort)local_108 >> 8;
                                    local_130.off = local_130.off + 2;
                                    iVar9 = ptls_buffer_reserve_aligned(&local_130,4,'\0');
                                    sVar27 = local_130.off;
                                    if (iVar9 == 0) {
                                      *(uint *)(local_130.base + local_130.off) =
                                           (uint)local_110 >> 0x18 |
                                           ((uint)local_110 & 0xff0000) >> 8 |
                                           ((uint)local_110 & 0xff00) << 8 | (uint)local_110 << 0x18
                                      ;
                                      local_130.off = local_130.off + 4;
                                      iVar9 = ptls_buffer_reserve_aligned(&local_130,2,'\0');
                                      sVar23 = local_130.off;
                                      sVar27 = local_130.off;
                                      if (iVar9 == 0) {
                                        (local_130.base + local_130.off)[0] = '\0';
                                        (local_130.base + local_130.off)[1] = '\0';
                                        sVar22 = local_130.off + 2;
                                        local_130.off = sVar22;
                                        if (((ppVar16->ticket_context).field_0x20 & 1) == 0) {
                                          if (local_100 != (char *)0x0) {
                                            sVar15 = strlen(local_100);
                                            iVar9 = ptls_buffer__do_pushv
                                                              (&local_130,local_100,sVar15);
                                            sVar27 = local_130.off;
                                            if (iVar9 != 0) goto LAB_00112c53;
                                          }
                                        }
                                        else {
                                          iVar9 = ptls_buffer_reserve_aligned(&local_130,0x20,'\0');
                                          sVar27 = local_130.off;
                                          if (iVar9 != 0) goto LAB_00112c53;
                                          uVar20 = *(undefined8 *)(ppVar16->ticket_context).bytes;
                                          uVar5 = *(undefined8 *)
                                                   ((ppVar16->ticket_context).bytes + 8);
                                          uVar6 = *(undefined8 *)
                                                   ((ppVar16->ticket_context).bytes + 0x18);
                                          *(undefined8 *)(local_130.base + local_130.off + 0x10) =
                                               *(undefined8 *)
                                                ((ppVar16->ticket_context).bytes + 0x10);
                                          *(undefined8 *)(local_130.base + local_130.off + 0x10 + 8)
                                               = uVar6;
                                          *(undefined8 *)(local_130.base + local_130.off) = uVar20;
                                          *(undefined8 *)(local_130.base + local_130.off + 8) =
                                               uVar5;
                                          local_130.off = local_130.off + 0x20;
                                        }
                                        sVar27 = local_130.off;
                                        iVar9 = iVar10;
                                        if (local_130.off - sVar22 < 0x10000) {
                                          uVar8 = (ushort)(local_130.off - sVar22);
                                          *(ushort *)(local_130.base + sVar23) =
                                               uVar8 << 8 | uVar8 >> 8;
                                          iVar9 = ptls_buffer_reserve_aligned(&local_130,1,'\0');
                                          pcVar2 = local_e8;
                                          sVar23 = local_130.off;
                                          sVar27 = local_130.off;
                                          if (iVar9 == 0) {
                                            local_130.base[local_130.off] = '\0';
                                            sVar22 = local_130.off + 1;
                                            local_130.off = sVar22;
                                            if (local_e8 != (char *)0x0) {
                                              sVar15 = strlen(local_e8);
                                              iVar9 = ptls_buffer__do_pushv
                                                                (&local_130,pcVar2,sVar15);
                                              sVar27 = local_130.off;
                                              if (iVar9 != 0) goto LAB_00112c53;
                                            }
                                            sVar27 = local_130.off;
                                            iVar9 = iVar10;
                                            if (local_130.off - sVar22 < 0x100) {
                                              local_130.base[sVar23] =
                                                   (uint8_t)(local_130.off - sVar22);
                                              if (local_130.off - local_e0 < 0x10000) {
                                                uVar8 = (ushort)(local_130.off - local_e0);
                                                *(ushort *)(local_130.base + sVar24) =
                                                     uVar8 << 8 | uVar8 >> 8;
                                                puVar25 = local_130.base;
                                                goto LAB_00112eec;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_00112d28:
                sVar27 = 0;
                iVar9 = iVar10;
              }
            }
            else {
              if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                              ,0x75d,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
              }
              ppVar11 = tls->key_schedule;
              iVar9 = ptls_buffer_reserve_aligned(ppVar26,1,'\0');
              if (iVar9 == 0) {
                ppVar26->base[ppVar26->off] = '\x05';
                ppVar26->off = ppVar26->off + 1;
                iVar9 = ptls_buffer_reserve_aligned(ppVar26,3,'\0');
                if (iVar9 == 0) {
                  puVar25 = ppVar26->base;
                  sVar24 = ppVar26->off;
                  puVar25[sVar24 + 2] = '\0';
                  puVar25 = puVar25 + sVar24;
                  puVar25[0] = '\0';
                  puVar25[1] = '\0';
                  sVar24 = ppVar26->off;
                  ppVar26->off = sVar24 + 3;
                  lVar17 = -3;
                  do {
                    ppVar26->base[lVar17 + 3 + sVar24] = '\0';
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 0);
                  if ((ppVar11 != (ptls_key_schedule_t *)0x0) && (ppVar11->num_hashes != 0)) {
                    puVar25 = ppVar26->base;
                    sVar24 = ppVar26->off;
                    pppVar18 = &ppVar11->hashes[0].ctx;
                    sVar23 = 0;
                    do {
                      (*(*pppVar18)->update)(*pppVar18,puVar25 + sVar27,sVar24 - sVar27);
                      sVar23 = sVar23 + 1;
                      pppVar18 = pppVar18 + 3;
                    } while (sVar23 != ppVar11->num_hashes);
                  }
                  ppVar26 = emitter->buf;
                  ppVar26->off = sVar27;
                  goto LAB_00112c15;
                }
              }
LAB_00112c4e:
              sVar27 = 0;
            }
LAB_00112c53:
            puVar25 = local_130.base;
            (*ptls_clear_memory)(local_130.base,sVar27);
            if (local_130.is_allocated != '\0') {
              free(puVar25);
            }
            psVar12 = tls->key_schedule->hashes[0].ctx;
            (*psVar12->final)(psVar12,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
            ppVar11 = tls->key_schedule;
            ppVar11->hashes[0].ctx = local_38;
            if (iVar9 != 0) {
              return iVar9;
            }
            bVar19 = (char)local_40 + 1;
            uVar20 = CONCAT71((int7)((ulong)local_40 >> 8),bVar19);
          } while (bVar19 < (tls->field_19).server.num_tickets_to_send);
          ppVar16 = tls->ctx;
        }
        iVar9 = 0x202;
        if ((ppVar16->field_0xb8 & 8) == 0) {
          iVar9 = 0;
        }
      }
    }
  }
  else if (iVar9 == 0x20b) {
    tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
    iVar9 = 0x20b;
  }
  return iVar9;
}

Assistant:

static int server_finish_handshake(ptls_t *tls, ptls_message_emitter_t *emitter, int send_cert_verify,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms)
{
    int ret;

    if (send_cert_verify) {
        if ((ret = send_certificate_verify(tls, emitter, signature_algorithms, PTLS_SERVER_CERTIFICATE_VERIFY_CONTEXT_STRING)) !=
            0) {
            if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
            }
            goto Exit;
        }
    }

    if ((ret = send_finished(tls, emitter)) != 0)
        goto Exit;

    assert(tls->key_schedule->generation == 2);
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 1, "s ap traffic", 3, 0, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, tls->server.pending_traffic_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    if (tls->pending_handshake_secret != NULL) {
        if (tls->ctx->omit_end_of_early_data) {
            if ((ret = commission_handshake_secret(tls)) != 0)
                goto Exit;
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
        } else {
            tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
    } else if (tls->ctx->require_client_authentication) {
        tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }

    /* send session ticket if necessary */
    if (tls->server.num_tickets_to_send != 0) {
        assert(tls->ctx->ticket_lifetime != 0);
        for (uint8_t i = 0; i < tls->server.num_tickets_to_send; ++i)
            if ((ret = send_session_ticket(tls, emitter)) != 0)
                goto Exit;
    }

    if (tls->ctx->require_client_authentication) {
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ret = 0;
    }

Exit:
    return ret;
}